

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_bea9::ktxTexture2_CreateCopyTest_CreateCopy_Test::TestBody
          (ktxTexture2_CreateCopyTest_CreateCopy_Test *this)

{
  VkFormat VVar1;
  ktx_uint32_t kVar2;
  ktx_uint8_t *pkVar3;
  wthTexInfo *pwVar4;
  long lVar5;
  VkFormat VVar6;
  size_t sVar7;
  char *pcVar8;
  char *in_R9;
  internal iVar9;
  bool bVar10;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktxTexture2 *copyTexture;
  ktxTexture2 *texture;
  ktx_error_code_e result;
  AssertHelper local_78;
  Message local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  AssertHelper local_40;
  long local_38;
  long local_30;
  ktx_error_code_e local_24;
  
  local_30 = 0;
  local_38 = 0;
  pkVar3 = (this->super_ktxTexture2_CreateCopyTest).
           super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
           super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.ktxMemFile;
  if (pkVar3 == (ktx_uint8_t *)0x0) {
    return;
  }
  local_24 = ktxTexture_CreateFromMemory
                       (pkVar3,(this->super_ktxTexture2_CreateCopyTest).
                               super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
                               super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.ktxMemFileLen,0,
                        &local_30);
  local_70.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_60,"result","KTX_SUCCESS",&local_24,(ktx_error_code_e *)&local_70);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x48b,pcVar8);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)CONCAT44(local_70.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_70.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_70.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  iVar9 = (internal)(local_30 != 0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = iVar9;
  if (local_30 == 0) {
    testing::Message::Message((Message *)&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) + 0x10),
               "ktxTexture_CreateFromMemory failed: ",0x24);
    pcVar8 = (char *)ktxErrorString(local_24);
    lVar5 = CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_);
    if (pcVar8 == (char *)0x0) {
      sVar7 = 6;
      pcVar8 = "(null)";
    }
    else {
      sVar7 = strlen(pcVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar5 + 0x10),pcVar8,sVar7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_70,(AssertionResult *)0x17896e,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x48c,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
LAB_00128187:
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) + 8))();
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    return;
  }
  local_24 = ktxTexture2_CreateCopy(local_30,&local_38);
  local_70.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_60,"result","KTX_SUCCESS",&local_24,(ktx_error_code_e *)&local_70);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x48f,pcVar8);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)CONCAT44(local_70.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_70.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_70.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  lVar5 = local_38;
  iVar9 = (internal)(local_38 != 0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = iVar9;
  if (!(bool)iVar9) {
    testing::Message::Message((Message *)&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) + 0x10),
               "ktxTexture_CreateFromMemory failed: ",0x24);
    pcVar8 = (char *)ktxErrorString(local_24);
    lVar5 = CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_);
    if (pcVar8 == (char *)0x0) {
      sVar7 = 6;
      pcVar8 = "(null)";
    }
    else {
      sVar7 = strlen(pcVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar5 + 0x10),pcVar8,sVar7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_70,(AssertionResult *)"copyTexture != __null",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x490,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
    goto LAB_00128187;
  }
  VVar1 = *(VkFormat *)(local_38 + 0x78);
  VVar6 = vkGetFormatFromOpenGLInternalFormat
                    ((this->super_ktxTexture2_CreateCopyTest).
                     super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
                     super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.helper.
                     super_WriterTestHelper<unsigned_char,_4U,_32856U>.texinfo.super_wthTexInfo.
                     super_ktxTextureCreateInfo.glInternalformat);
  if ((VVar1 == VVar6) &&
     (pwVar4 = (this->super_ktxTexture2_CreateCopyTest).
               super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
               super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.texinfo,
     *(ktx_uint32_t *)(lVar5 + 0x24) == (pwVar4->super_ktxTextureCreateInfo).baseWidth)) {
    kVar2 = (pwVar4->super_ktxTextureCreateInfo).baseHeight;
    if (kVar2 == 0) {
      if (*(ktx_uint32_t *)(lVar5 + 0x28) == 1) goto LAB_001281db;
    }
    else if (*(ktx_uint32_t *)(lVar5 + 0x28) == kVar2) {
LAB_001281db:
      kVar2 = (pwVar4->super_ktxTextureCreateInfo).baseDepth;
      if (kVar2 == 0) {
        if (*(ktx_uint32_t *)(lVar5 + 0x2c) == 1) goto LAB_001281f1;
      }
      else if (*(ktx_uint32_t *)(lVar5 + 0x2c) == kVar2) {
LAB_001281f1:
        if (*(ktx_uint32_t *)(lVar5 + 0x3c) == (pwVar4->super_ktxTextureCreateInfo).numFaces) {
          bVar10 = *(ktx_uint32_t *)(lVar5 + 0x34) == (pwVar4->super_ktxTextureCreateInfo).numLevels
          ;
          goto LAB_00128208;
        }
      }
    }
  }
  bVar10 = false;
LAB_00128208:
  local_70.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_70.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,bVar10);
  local_78.data_._0_4_ = CONCAT31(local_78.data_._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_60,"compareTexture(copyTexture)","true",(bool *)&local_70,
             (bool *)&local_78);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x493,pcVar8);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)CONCAT44(local_70.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_70.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_70.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_70.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       memcmp(*(void **)(local_30 + 0x70),*(void **)(local_38 + 0x70),*(size_t *)(local_30 + 0x68));
  local_78.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_60,"memcmp(texture->pData, copyTexture->pData, texture->dataSize)",
             "0",(int *)&local_70,(int *)&local_78);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x495,pcVar8);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)CONCAT44(local_70.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_70.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_70.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_70.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = memcmp(*(void **)(local_30 + 0x18),*(void **)(local_38 + 0x18),0xa8);
  local_78.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_60,
             "memcmp(texture->_protected, copyTexture->_protected, sizeof(ktxTexture_protected))",
             "0",(int *)&local_70,(int *)&local_78);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x497,pcVar8);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)CONCAT44(local_70.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_70.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_70.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_70.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       memcmp(*(void **)(local_30 + 0xa0),*(void **)(local_38 + 0xa0),
              (ulong)(*(int *)(local_30 + 0x34) - 1) * 0x18 + 0x38);
  local_78.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_60,"memcmp(texture->_private, copyTexture->_private, privateSize)",
             "0",(int *)&local_70,(int *)&local_78);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_70);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x49c,pcVar8);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)CONCAT44(local_70.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_70.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_70.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  if (local_30 != 0) {
    (*(code *)**(undefined8 **)(local_30 + 8))();
  }
  if (local_38 == 0) {
    return;
  }
  (*(code *)**(undefined8 **)(local_38 + 8))();
  return;
}

Assistant:

TEST_F(ktxTexture2_CreateCopyTest, CreateCopy) {
    ktxTexture2* texture = 0;
    ktxTexture2* copyTexture = 0;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             0,
                                             (ktxTexture**)&texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        result = ktxTexture2_CreateCopy(texture, &copyTexture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(copyTexture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);

        EXPECT_EQ(compareTexture(copyTexture), true);
        EXPECT_EQ(memcmp(texture->pData, copyTexture->pData, texture->dataSize),
                  0);
        EXPECT_EQ(memcmp(texture->_protected, copyTexture->_protected,
                         sizeof(ktxTexture_protected)), 0);
        ktx_size_t privateSize = sizeof(ktxTexture2_private)
                               + sizeof(ktxLevelIndexEntry)
                               * (texture->numLevels - 1);
        EXPECT_EQ(memcmp(texture->_private, copyTexture->_private,
                         privateSize), 0);

        if (texture)
            ktxTexture_Destroy((ktxTexture*)texture);
        if (copyTexture)
            ktxTexture_Destroy((ktxTexture*)copyTexture);
    }
}